

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitFunctionDecl(CodegenVisitor *this,FunctionDecl *funcDecl)

{
  SQUnsignedInteger *pSVar1;
  SQInstruction *pSVar2;
  SQObjectType SVar3;
  uint uVar4;
  uint uVar5;
  SQTable *pSVar6;
  SQFuncState *pSVar7;
  ParamDecl **ppPVar8;
  Node *this_00;
  long lVar9;
  Block *pBVar10;
  SQFloat SVar11;
  undefined4 uVar12;
  SQObjectFlags SVar13;
  undefined3 uVar14;
  FunctionDecl *pFVar15;
  SQFuncState *pSVar16;
  SQString *pSVar17;
  SQInteger SVar18;
  SQObjectValue SVar19;
  SQObjectPtr *pSVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  SQObject SVar24;
  SQOptimizer opt;
  undefined1 local_68 [8];
  SQObjectValue SStack_60;
  SQFuncState *local_40;
  FunctionDecl *local_38;
  
  lVar23 = (long)(funcDecl->super_Decl).super_Statement.super_Node._coordinates.lineStart;
  if (lVar23 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar23,this->_lineinfo,false);
  }
  local_40 = this->_childFs;
  pSVar16 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  this->_childFs = pSVar16;
  SVar24 = SQFuncState::CreateString(this->_fs,funcDecl->_name,-1);
  pSVar16 = this->_childFs;
  SVar3 = (pSVar16->_name).super_SQObject._type;
  pSVar6 = (pSVar16->_name).super_SQObject._unVal.pTable;
  (pSVar16->_name).super_SQObject = SVar24;
  if (((pSVar16->_name).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((SVar24._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
              _uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar17 = SQString::Create(this->_vm->_sharedstate,funcDecl->_sourcename,-1);
  pSVar16 = this->_fs;
  pSVar6 = (pSVar16->_sourcename).super_SQObject._unVal.pTable;
  SVar3 = (pSVar16->_sourcename).super_SQObject._type;
  (pSVar16->_sourcename).super_SQObject._type = OT_STRING;
  (pSVar16->_sourcename).super_SQObject._flags = '\0';
  (pSVar16->_sourcename).super_SQObject._unVal.pString = pSVar17;
  pSVar1 = &(pSVar17->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = this->_childFs;
  SVar3 = (pSVar7->_sourcename).super_SQObject._type;
  pSVar6 = (pSVar7->_sourcename).super_SQObject._unVal.pTable;
  SVar13 = (pSVar16->_sourcename).super_SQObject._flags;
  uVar14 = *(undefined3 *)&(pSVar16->_sourcename).super_SQObject.field_0x5;
  SVar11 = (pSVar16->_sourcename).super_SQObject._unVal.fFloat;
  uVar12 = *(undefined4 *)((long)&(pSVar16->_sourcename).super_SQObject._unVal + 4);
  (pSVar7->_sourcename).super_SQObject._type = (pSVar16->_sourcename).super_SQObject._type;
  (pSVar7->_sourcename).super_SQObject._flags = SVar13;
  *(undefined3 *)&(pSVar7->_sourcename).super_SQObject.field_0x5 = uVar14;
  (pSVar7->_sourcename).super_SQObject._unVal.fFloat = SVar11;
  *(undefined4 *)((long)&(pSVar7->_sourcename).super_SQObject._unVal + 4) = uVar12;
  if (((pSVar7->_sourcename).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((pSVar7->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar16 = this->_childFs;
  pSVar16->_varparams = funcDecl->_vararg;
  _local_68 = SQFuncState::CreateString(this->_fs,"this",-1);
  SQFuncState::AddParameter(pSVar16,(SQObject *)local_68);
  uVar22 = (ulong)(funcDecl->_parameters)._size;
  local_38 = funcDecl;
  if (uVar22 == 0) {
    lVar23 = 0;
  }
  else {
    ppPVar8 = (funcDecl->_parameters)._vals;
    lVar21 = 0;
    lVar23 = 0;
    do {
      this_00 = *(Node **)((long)ppPVar8 + lVar21);
      Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
      lVar9._0_4_ = this_00[1]._coordinates.lineStart;
      lVar9._4_4_ = this_00[1]._coordinates.columnStart;
      if (lVar9 != 0) {
        pSVar16 = this->_childFs;
        SVar18 = SQFuncState::TopTarget(this->_fs);
        SQFuncState::AddDefaultParam(pSVar16,SVar18);
        lVar23 = lVar23 + 1;
      }
      lVar21 = lVar21 + 8;
    } while (uVar22 << 3 != lVar21);
  }
  if (0 < lVar23) {
    do {
      SQFuncState::PopTarget(this->_fs);
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  pFVar15 = local_38;
  pBVar10 = local_38->_body;
  lVar23 = (long)*(int *)&pBVar10->field_0x8;
  if (lVar23 != -1) {
    SQFuncState::AddLineInfos(this->_childFs,lVar23,this->_lineinfo,false);
  }
  pSVar16 = this->_childFs;
  this->_fs = pSVar16;
  this->_childFs = (SQFuncState *)0x0;
  Node::visit<SQCompilation::CodegenVisitor>((Node *)pFVar15->_body,this);
  this->_childFs = pSVar16;
  this->_fs = pSVar16->_parent;
  SQFuncState::AddLineInfos(pSVar16,(long)*(int *)&pBVar10->field_0x10,this->_lineinfo,true);
  local_68._0_4_ = 0;
  local_68[4] = '\x1d';
  local_68._5_3_ = 0xff;
  SQFuncState::AddInstruction(this->_childFs,(SQInstruction *)local_68);
  if ((this->_childFs->lang_features & 0x200) == 0) {
    SQOptimizer::SQOptimizer((SQOptimizer *)local_68,this->_childFs);
    SQOptimizer::optimize((SQOptimizer *)local_68);
    sqvector<SQOptimizer::Jump,_unsigned_int>::~sqvector
              ((sqvector<SQOptimizer::Jump,_unsigned_int> *)local_68);
  }
  SQFuncState::SetStackSize(this->_childFs,0);
  pSVar16 = this->_childFs;
  pSVar16->_hoistLevel = (long)pFVar15->_hoistingLevel;
  SVar19.pFunctionProto = SQFuncState::BuildProto(pSVar16);
  pSVar16 = this->_fs;
  local_68._0_4_ = OT_FUNCPROTO;
  local_68[4] = '\0';
  SStack_60.pTable = SVar19.pTable;
  pSVar1 = &((SVar19.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  uVar4 = (pSVar16->_functions)._size;
  uVar5 = (pSVar16->_functions)._allocated;
  if (uVar5 <= uVar4) {
    uVar4 = uVar4 * 2;
    uVar22 = 4;
    if (uVar4 != 0) {
      uVar22 = (ulong)uVar4;
    }
    pSVar20 = (SQObjectPtr *)
              sq_vm_realloc((pSVar16->_functions)._alloc_ctx,(pSVar16->_functions)._vals,
                            (ulong)uVar5 << 4,uVar22 << 4);
    (pSVar16->_functions)._vals = pSVar20;
    (pSVar16->_functions)._allocated = (size_type)uVar22;
  }
  SVar24 = _local_68;
  pSVar20 = (pSVar16->_functions)._vals;
  uVar4 = (pSVar16->_functions)._size;
  (pSVar16->_functions)._size = uVar4 + 1;
  pSVar2 = (SQInstruction *)(pSVar20 + uVar4);
  pSVar2->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_68._0_4_;
  pSVar2->op = local_68[4];
  pSVar2->_arg0 = local_68[5];
  pSVar2->_arg2 = local_68[6];
  pSVar2->_arg3 = local_68[7];
  ((SQObjectValue *)(pSVar2 + 1))->nInteger = (SQInteger)SStack_60;
  if ((pSVar20[uVar4].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar20[uVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  _local_68 = SVar24;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
  SQFuncState::PopChildState(this->_fs);
  this->_childFs = local_40;
  pSVar16 = this->_fs;
  SVar18 = SQFuncState::PushTarget(pSVar16,-1);
  SVar24 = _local_68;
  local_68[5] = (char)SVar18;
  local_68._0_4_ = 0;
  local_68[4] = ':';
  local_68._0_4_ = (this->_fs->_functions)._size - 1;
  local_68[6] = pFVar15->_lambda;
  SStack_60 = SVar24._unVal;
  local_68[7] = 0;
  SQFuncState::AddInstruction(pSVar16,(SQInstruction *)local_68);
  return;
}

Assistant:

void CodegenVisitor::visitFunctionDecl(FunctionDecl *funcDecl) {
    addLineNumber(funcDecl);

    SQFuncState *savedChildFsAtRoot = _childFs; // may be non-null when processing default argument that is declared as function/lambda
    _childFs = _fs->PushChildState(_ss(_vm));

    _childFs->_name = _fs->CreateString(funcDecl->name());
    _childFs->_sourcename = _fs->_sourcename = SQString::Create(_ss(_vm), funcDecl->sourceName());
    _childFs->_varparams = funcDecl->isVararg();

    SQInteger defparams = 0;

    _childFs->AddParameter(_fs->CreateString("this"));

    for (auto param : funcDecl->parameters()) {
        param->visit(this);
        if (param->hasDefaultValue()) {
            _childFs->AddDefaultParam(_fs->TopTarget());
            ++defparams;
        }
    }

    for (SQInteger n = 0; n < defparams; n++) {
        _fs->PopTarget();
    }

    Block *body = funcDecl->body();
    SQInteger startLine = body->lineStart();
    if (startLine != -1) {
        _childFs->AddLineInfos(startLine, _lineinfo, false);
    }

    {
        assert(_childFs->_parent == _fs);
        SQFuncState *savedChildFsAtBody = _childFs;
        _fs = _childFs;
        _childFs = NULL;

        funcDecl->body()->visit(this);

        _childFs = savedChildFsAtBody;
        _fs = _childFs->_parent;
    }

    _childFs->AddLineInfos(body->lineEnd(), _lineinfo, true);
    _childFs->AddInstruction(_OP_RETURN, -1);

    if (!(_childFs->lang_features & LF_DISABLE_OPTIMIZER)) {
        SQOptimizer opt(*_childFs);
        opt.optimize();
    }

    _childFs->SetStackSize(0);
    _childFs->_hoistLevel = funcDecl->hoistingLevel();
    SQFunctionProto *funcProto = _childFs->BuildProto();

    _fs->_functions.push_back(funcProto);

    _fs->PopChildState();
    _childFs = savedChildFsAtRoot;

    _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, funcDecl->isLambda() ? 1 : 0);
}